

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralSubstitutionTree.hpp
# Opt level: O2

ostream * Indexing::operator<<
                    (ostream *out,
                    Multiline<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_> *self)

{
  unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
  *puVar1;
  Node *pNVar2;
  Symbol *self_00;
  bool bVar3;
  char cVar4;
  ostream *poVar5;
  char *pcVar6;
  uint uVar7;
  unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
  *t;
  unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
  *puVar8;
  Multiline<Indexing::SubstitutionTree<Indexing::LiteralClause>_> local_40;
  
  poVar5 = std::operator<<(out,"{ ");
  std::endl<char,std::char_traits<char>>(poVar5);
  puVar1 = (self->self->_trees)._cursor;
  uVar7 = 0;
  bVar3 = false;
  for (puVar8 = (self->self->_trees)._stack; puVar8 != puVar1; puVar8 = puVar8 + 1) {
    pNVar2 = ((puVar8->_M_t).
              super___uniq_ptr_impl<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>_*,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
              .super__Head_base<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>_*,_false>.
             _M_head_impl)->_root;
    if (pNVar2 != (Node *)0x0) {
      cVar4 = (**(code **)((long)pNVar2->_vptr_Node + 0x18))();
      if (cVar4 == '\0') {
        self_00 = *(Symbol **)(*(long *)(DAT_00a14190 + 0x80) + (ulong)(uVar7 >> 1) * 8);
        Lib::Output::Multiline<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_>::
        outputIndent(out,self->indent);
        pcVar6 = "~";
        if (!bVar3) {
          pcVar6 = " ";
        }
        poVar5 = std::operator<<(out,pcVar6);
        poVar5 = Kernel::operator<<(poVar5,self_00);
        poVar5 = std::operator<<(poVar5,"(");
        local_40.self =
             (puVar8->_M_t).
             super___uniq_ptr_impl<Indexing::SubstitutionTree<Indexing::LiteralClause>,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>_*,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>_>_>
             .super__Head_base<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>_*,_false>.
             _M_head_impl;
        local_40.indent = self->indent + 1;
        poVar5 = operator<<(poVar5,&local_40);
        poVar5 = std::operator<<(poVar5,")");
        std::endl<char,std::char_traits<char>>(poVar5);
      }
    }
    uVar7 = uVar7 + 1;
    bVar3 = (bool)(bVar3 ^ 1);
  }
  poVar5 = std::operator<<(out,"} ");
  return poVar5;
}

Assistant:

std::ostream& operator<<(std::ostream& out, Output::Multiline<LiteralSubstitutionTree<LeafData_>> const& self)
  { 
    int i = 0;
    out << "{ " << std::endl;
    for (auto& t : self.self._trees) {
      if (!t->isEmpty()) {
        auto f = env.signature->getPredicate(idxToFunctor(i));
        Output::Multiline<LiteralSubstitutionTree>::outputIndent(out, self.indent);
        out << (idxIsNegative(i) ? "~" : " ") << *f << "(" << Output::multiline(*t, self.indent + 1) << ")" << std::endl; 
      }
      i++;
    }
    return out << "} ";
  }